

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRProgram.cc
# Opt level: O1

ConstantValue<flow::util::RegExp,_(flow::LiteralType)7> * __thiscall
flow::IRProgram::
get<flow::ConstantValue<flow::util::RegExp,(flow::LiteralType)7>,flow::util::RegExp>
          (IRProgram *this,
          vector<std::unique_ptr<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>,_std::default_delete<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>,_std::default_delete<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>_>_>_>_>
          *table,RegExp *literal)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  ConstantValue<flow::util::RegExp,_(flow::LiteralType)7> *extraout_RAX;
  ConstantValue<flow::util::RegExp,_(flow::LiteralType)7> *extraout_RAX_00;
  ConstantValue<flow::util::RegExp,_(flow::LiteralType)7> *this_00;
  _Head_base<0UL,_flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>_*,_false> _Var3;
  long lVar4;
  long lVar5;
  bool bVar6;
  _Head_base<0UL,_flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>_*,_false> local_80;
  RegExp *local_78;
  RegExp local_70;
  
  _Var3._M_head_impl =
       (ConstantValue<flow::util::RegExp,_(flow::LiteralType)7> *)
       (table->
       super__Vector_base<std::unique_ptr<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>,_std::default_delete<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>,_std::default_delete<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>_>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  lVar5 = (long)(table->
                super__Vector_base<std::unique_ptr<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>,_std::default_delete<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>,_std::default_delete<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)_Var3._M_head_impl;
  bVar6 = lVar5 == 0;
  if (!bVar6) {
    lVar4 = 0;
    local_78 = literal;
    do {
      util::RegExp::RegExp
                (&local_70,
                 (RegExp *)
                 ((long)(table->
                        super__Vector_base<std::unique_ptr<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>,_std::default_delete<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>,_std::default_delete<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>_>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start[lVar4]._M_t.
                        super___uniq_ptr_impl<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>,_std::default_delete<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>_>_>
                        ._M_t + 0x48));
      if (local_70.pattern_._M_string_length == (literal->pattern_)._M_string_length) {
        if (local_70.pattern_._M_string_length == 0) {
          util::RegExp::~RegExp(&local_70);
        }
        else {
          iVar2 = bcmp(local_70.pattern_._M_dataplus._M_p,(literal->pattern_)._M_dataplus._M_p,
                       local_70.pattern_._M_string_length);
          util::RegExp::~RegExp(&local_70);
          _Var3._M_head_impl = extraout_RAX;
          literal = local_78;
          if (iVar2 != 0) goto LAB_0014fe5c;
        }
        _Var3._M_head_impl =
             *(ConstantValue<flow::util::RegExp,_(flow::LiteralType)7> **)
              &(table->
               super__Vector_base<std::unique_ptr<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>,_std::default_delete<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>,_std::default_delete<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start[lVar4]._M_t.
               super___uniq_ptr_impl<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>,_std::default_delete<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>_>_>
               ._M_t;
        break;
      }
      util::RegExp::~RegExp(&local_70);
      _Var3._M_head_impl = extraout_RAX_00;
LAB_0014fe5c:
      lVar4 = lVar4 + 1;
      bVar6 = lVar5 >> 3 == lVar4;
    } while (!bVar6);
  }
  if (bVar6) {
    this_00 = (ConstantValue<flow::util::RegExp,_(flow::LiteralType)7> *)operator_new(0x88);
    paVar1 = &local_70.pattern_.field_2;
    local_70.pattern_._M_string_length = 0;
    local_70.pattern_.field_2._M_local_buf[0] = '\0';
    local_70.pattern_._M_dataplus._M_p = (pointer)paVar1;
    ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>::ConstantValue
              (this_00,literal,&local_70.pattern_);
    local_80._M_head_impl = this_00;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70.pattern_._M_dataplus._M_p != paVar1) {
      operator_delete(local_70.pattern_._M_dataplus._M_p,
                      CONCAT71(local_70.pattern_.field_2._M_allocated_capacity._1_7_,
                               local_70.pattern_.field_2._M_local_buf[0]) + 1);
    }
    std::
    vector<std::unique_ptr<flow::ConstantValue<flow::util::RegExp,(flow::LiteralType)7>,std::default_delete<flow::ConstantValue<flow::util::RegExp,(flow::LiteralType)7>>>,std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::RegExp,(flow::LiteralType)7>,std::default_delete<flow::ConstantValue<flow::util::RegExp,(flow::LiteralType)7>>>>>
    ::
    emplace_back<std::unique_ptr<flow::ConstantValue<flow::util::RegExp,(flow::LiteralType)7>,std::default_delete<flow::ConstantValue<flow::util::RegExp,(flow::LiteralType)7>>>>
              ((vector<std::unique_ptr<flow::ConstantValue<flow::util::RegExp,(flow::LiteralType)7>,std::default_delete<flow::ConstantValue<flow::util::RegExp,(flow::LiteralType)7>>>,std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::RegExp,(flow::LiteralType)7>,std::default_delete<flow::ConstantValue<flow::util::RegExp,(flow::LiteralType)7>>>>>
                *)table,(unique_ptr<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>,_std::default_delete<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>_>_>
                         *)&local_80);
    if (local_80._M_head_impl != (ConstantValue<flow::util::RegExp,_(flow::LiteralType)7> *)0x0) {
      (*((local_80._M_head_impl)->super_Constant).super_Value._vptr_Value[1])();
    }
    _Var3._M_head_impl =
         (table->
         super__Vector_base<std::unique_ptr<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>,_std::default_delete<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>,_std::default_delete<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>_>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
         super___uniq_ptr_impl<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>,_std::default_delete<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>_*,_std::default_delete<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>_>_>
         .
         super__Head_base<0UL,_flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>_*,_false>
         ._M_head_impl;
  }
  return _Var3._M_head_impl;
}

Assistant:

T* IRProgram::get(std::vector<std::unique_ptr<T>>& table, const U& literal) {
  for (size_t i = 0, e = table.size(); i != e; ++i)
    if (table[i]->get() == literal)
      return table[i].get();

  table.emplace_back(std::make_unique<T>(literal));
  return table.back().get();
}